

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O3

ObjectPtr __thiscall ICM::DefFunc::Calc::Mod::func(Mod *this,DataList *list)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  long in_RDX;
  Rational<long> RVar3;
  
  RVar3 = Common::Number::mod<long>
                    (*(long **)(**(long **)(in_RDX + 8) + 8),
                     *(long **)((*(long **)(in_RDX + 8))[1] + 8));
  pp_Var1 = (_func_int **)operator_new(0x10);
  *pp_Var1 = (_func_int *)0x8;
  pp_Var1[1] = (_func_int *)0x0;
  p_Var2 = (_func_int *)operator_new(8);
  *(Type *)p_Var2 = RVar3._numerator;
  pp_Var1[1] = p_Var2;
  (this->super_FI)._vptr_FuncInitObject = pp_Var1;
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					const auto &rr = Common::Number::mod(list[0]->dat<T_Number>(), list[1]->dat<T_Number>());
					return ObjectPtr(new Number((int_t)rr.num()));
				}